

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O0

void prvTidyfreeStdIOFileSource(TidyInputSource *inp,Bool closeIt)

{
  long *plVar1;
  FileSource *fin;
  Bool closeIt_local;
  TidyInputSource *inp_local;
  
  plVar1 = (long *)inp->sourceData;
  if (((closeIt != no) && (plVar1 != (long *)0x0)) && (*plVar1 != 0)) {
    fclose((FILE *)*plVar1);
  }
  tidyBufFree((TidyBuffer *)(plVar1 + 1));
  if (plVar1 != (long *)0x0) {
    (**(code **)(*(long *)plVar1[1] + 0x10))(plVar1[1],plVar1);
  }
  return;
}

Assistant:

void TY_(freeFileSource)( TidyInputSource* inp, Bool closeIt )
{
    FileSource* fin = (FileSource*) inp->sourceData;
    if ( closeIt && fin && fin->fp )
      fclose( fin->fp );
    tidyBufFree( &fin->unget );
    if (fin)
        TidyFree( fin->unget.allocator, fin );
}